

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

bool bssl::parse_dtls13_record(SSL *ssl,CBS *in,ParsedDTLSRecord *out)

{
  byte bVar1;
  ParsedDTLSRecord *cbs;
  bool bVar2;
  bool bVar3;
  uint16_t wire_seq;
  int iVar4;
  uint uVar5;
  pointer __b;
  unsigned_short *puVar6;
  CBS *out_00;
  pointer ctx;
  pointer pDVar7;
  pointer pRVar8;
  size_t sVar9;
  byte *pbVar10;
  ulong uVar11;
  uint64_t uVar12;
  size_t extraout_RDX;
  CBS cbs_00;
  OPENSSL_timeval OVar13;
  DTLSRecordNumber local_c8;
  uint64_t local_c0;
  uint64_t full_seq;
  size_t i;
  uint64_t seq;
  uint8_t *local_a0;
  undefined1 local_98 [8];
  Span<unsigned_char> writable_seq;
  size_t local_80;
  Span<unsigned_char> local_78;
  byte local_62 [2];
  DTLSReadEpoch *pDStack_60;
  uint8_t mask [2];
  DTLSReadEpoch *read_epoch;
  undefined1 local_48 [8];
  CBS seq_bytes;
  size_t seq_len;
  uint16_t epoch;
  ParsedDTLSRecord *pPStack_28;
  uint16_t max_epoch;
  ParsedDTLSRecord *out_local;
  CBS *in_local;
  SSL *ssl_local;
  
  if ((out->type & 0x10) == 0) {
    seq_len._6_2_ = (ssl->d1->read_epoch).epoch;
    pPStack_28 = out;
    out_local = (ParsedDTLSRecord *)in;
    in_local = (CBS *)ssl;
    bVar2 = std::operator!=(&ssl->d1->next_read_epoch,(nullptr_t)0x0);
    if (bVar2) {
      __b = std::unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::operator->
                      ((unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter> *)
                       (in_local[3].len + 0x90));
      puVar6 = std::max<unsigned_short>((unsigned_short *)((long)&seq_len + 6),&__b->epoch);
      seq_len._6_2_ = *puVar6;
    }
    seq_len._4_2_ = reconstruct_epoch(pPStack_28->type,seq_len._6_2_);
    iVar4 = 1;
    if ((pPStack_28->type & 8) != 0) {
      iVar4 = 2;
    }
    seq_bytes.len = (size_t)iVar4;
    iVar4 = CBS_get_bytes((CBS *)out_local,(CBS *)local_48,seq_bytes.len);
    cbs = out_local;
    if (iVar4 == 0) {
      ssl_local._7_1_ = false;
    }
    else {
      if ((pPStack_28->type & 4) == 0) {
        out_00 = &pPStack_28->body;
        sVar9 = CBS_len((CBS *)out_local);
        iVar4 = CBS_get_bytes((CBS *)cbs,out_00,sVar9);
        if (iVar4 == 0) {
          abort();
        }
      }
      else {
        iVar4 = CBS_get_u16_length_prefixed((CBS *)out_local,&pPStack_28->body);
        if (iVar4 == 0) {
          return false;
        }
      }
      bVar3 = std::operator!=((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                              (in_local[3].len + 0x98),(nullptr_t)0x0);
      bVar2 = false;
      if (bVar3) {
        ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&in_local[6].len);
        OVar13 = ssl_ctx_get_current_time(ctx);
        pDVar7 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                            (in_local[3].len + 0x98));
        bVar2 = pDVar7->expire < OVar13.tv_sec;
      }
      if (bVar2) {
        std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::operator=
                  ((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                   (in_local[3].len + 0x98),(nullptr_t)0x0);
      }
      pDStack_60 = dtls_get_read_epoch((SSL *)in_local,seq_len._4_2_);
      if ((pDStack_60 != (DTLSReadEpoch *)0x0) &&
         (bVar2 = use_dtls13_record_header((SSL *)in_local,seq_len._4_2_), bVar2)) {
        pPStack_28->read_epoch = pDStack_60;
        pRVar8 = std::unique_ptr<bssl::RecordNumberEncrypter,_bssl::internal::Deleter>::operator->
                           (&pDStack_60->rn_encrypter);
        Span<unsigned_char>::Span<2ul>(&local_78,(uchar (*) [2])local_62);
        join_0x00000010_0x00000000_ = cbs_st::operator_cast_to_Span(&pPStack_28->body);
        uVar5 = (*pRVar8->_vptr_RecordNumberEncrypter[4])
                          (pRVar8,local_78.data_,local_78.size_,writable_seq.size_,local_80);
        if ((uVar5 & 1) == 0) {
          return false;
        }
        seq = (uint64_t)local_48;
        local_a0 = seq_bytes.data;
        cbs_00.len = extraout_RDX;
        cbs_00.data = seq_bytes.data;
        _local_98 = cbs_to_writable_bytes((bssl *)local_48,cbs_00);
        i = 0;
        for (full_seq = 0; uVar12 = full_seq,
            sVar9 = Span<unsigned_char>::size((Span<unsigned_char> *)local_98), uVar12 < sVar9;
            full_seq = full_seq + 1) {
          bVar1 = local_62[full_seq];
          pbVar10 = Span<unsigned_char>::operator[]((Span<unsigned_char> *)local_98,full_seq);
          *pbVar10 = *pbVar10 ^ bVar1;
          uVar11 = i << 8;
          pbVar10 = Span<unsigned_char>::operator[]((Span<unsigned_char> *)local_98,full_seq);
          i = uVar11 | *pbVar10;
        }
        wire_seq = (uint16_t)i;
        uVar11 = seq_bytes.len & 0x1fffffff;
        uVar12 = DTLSReplayBitmap::max_seq_num(&pDStack_60->bitmap);
        local_c0 = reconstruct_seqnum(wire_seq,(long)((1 << ((byte)(uVar11 << 3) & 0x1f)) + -1),
                                      uVar12);
        DTLSRecordNumber::DTLSRecordNumber(&local_c8,seq_len._4_2_,local_c0);
        (pPStack_28->number).combined_ = local_c8.combined_;
      }
      ssl_local._7_1_ = true;
    }
  }
  else {
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

static bool parse_dtls13_record(SSL *ssl, CBS *in, ParsedDTLSRecord *out) {
  if (out->type & 0x10) {
    // Connection ID bit set, which we didn't negotiate.
    return false;
  }

  uint16_t max_epoch = ssl->d1->read_epoch.epoch;
  if (ssl->d1->next_read_epoch != nullptr) {
    max_epoch = std::max(max_epoch, ssl->d1->next_read_epoch->epoch);
  }
  uint16_t epoch = reconstruct_epoch(out->type, max_epoch);
  size_t seq_len = (out->type & 0x08) ? 2 : 1;
  CBS seq_bytes;
  if (!CBS_get_bytes(in, &seq_bytes, seq_len)) {
    return false;
  }
  if (out->type & 0x04) {
    // 16-bit length present
    if (!CBS_get_u16_length_prefixed(in, &out->body)) {
      return false;
    }
  } else {
    // No length present - the remaining contents are the whole packet.
    // CBS_get_bytes is used here to advance |in| to the end so that future
    // code that computes the number of consumed bytes functions correctly.
    BSSL_CHECK(CBS_get_bytes(in, &out->body, CBS_len(in)));
  }

  // Drop the previous read epoch if expired.
  if (ssl->d1->prev_read_epoch != nullptr &&
      ssl_ctx_get_current_time(ssl->ctx.get()).tv_sec >
          ssl->d1->prev_read_epoch->expire) {
    ssl->d1->prev_read_epoch = nullptr;
  }

  // Look up the corresponding epoch. This header form only matches encrypted
  // DTLS 1.3 epochs.
  DTLSReadEpoch *read_epoch = dtls_get_read_epoch(ssl, epoch);
  if (read_epoch != nullptr && use_dtls13_record_header(ssl, epoch)) {
    out->read_epoch = read_epoch;

    // Decrypt and reconstruct the sequence number:
    uint8_t mask[2];
    if (!read_epoch->rn_encrypter->GenerateMask(mask, out->body)) {
      // GenerateMask most likely failed because the record body was not long
      // enough.
      return false;
    }
    // Apply the mask to the sequence number in-place. The header (with the
    // decrypted sequence number bytes) is used as the additional data for the
    // AEAD function.
    auto writable_seq = cbs_to_writable_bytes(seq_bytes);
    uint64_t seq = 0;
    for (size_t i = 0; i < writable_seq.size(); i++) {
      writable_seq[i] ^= mask[i];
      seq = (seq << 8) | writable_seq[i];
    }
    uint64_t full_seq = reconstruct_seqnum(seq, (1 << (seq_len * 8)) - 1,
                                           read_epoch->bitmap.max_seq_num());
    out->number = DTLSRecordNumber(epoch, full_seq);
  }

  return true;
}